

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

void __thiscall
kratos::SystemVerilogCodeGen::generate_port_interface
          (SystemVerilogCodeGen *this,InstantiationStmt *stmt)

{
  _Rb_tree_header *p_Var1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  Port *pPVar4;
  Port *pPVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  pointer __n;
  ulong uVar8;
  pointer ppVar9;
  char cVar10;
  int iVar11;
  _Base_ptr p_Var12;
  ulong uVar13;
  long lVar14;
  mapped_type *ppSVar15;
  long *plVar16;
  undefined4 extraout_var;
  iterator iVar17;
  iterator iVar18;
  ostream *poVar19;
  StmtException *this_00;
  InternalException *this_01;
  _Base_ptr p_Var20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var21;
  char *pcVar22;
  undefined1 auVar23 [8];
  _Base_ptr p_Var24;
  _Base_ptr p_Var25;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined8 uVar26;
  __normal_iterator<std::pair<kratos::Port_*,_kratos::Var_*>_*,_std::vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>_>
  __i;
  pointer ppVar27;
  long lVar28;
  string_view sVar29;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<kratos::IRNode_*> __l;
  Port *local_1f0;
  Var *local_1e8;
  undefined1 local_1e0 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  interface_names;
  undefined1 local_188 [8];
  map<kratos::Var_*,_kratos::Stmt_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
  debug_info;
  shared_ptr<kratos::InterfacePort> internal_interface;
  undefined1 auStack_138 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  connections;
  undefined1 auStack_118 [8];
  string mod_port_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> potential_name;
  string internal_name;
  vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
  ports;
  string external_name;
  undefined1 auStack_78 [8];
  shared_ptr<kratos::InterfaceRef> i;
  size_type *local_58;
  size_type local_48 [2];
  allocator_type local_31;
  
  puVar2 = &(this->stream_).super_stringstream.field_0x10;
  if ((stmt->port_mapping_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2,"();",3);
    puVar3 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar3 = *(long *)puVar3 + 1;
    auStack_78[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2,auStack_78,1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2," (",2);
    puVar3 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar3 = *(long *)puVar3 + 1;
    auStack_78[0] = (string)0xa;
    external_name.field_2._8_8_ = puVar2;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2,auStack_78,1);
    this->indent_ = this->indent_ + 1;
    internal_name.field_2._8_8_ = 0;
    ports.
    super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ports.
    super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
    ::reserve((vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
               *)((long)&internal_name.field_2 + 8),
              (stmt->port_mapping_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    p_Var12 = (stmt->port_mapping_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(stmt->port_mapping_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var12 != p_Var1) {
      do {
        std::
        vector<std::pair<kratos::Port*,kratos::Var*>,std::allocator<std::pair<kratos::Port*,kratos::Var*>>>
        ::emplace_back<std::pair<kratos::Port*const,kratos::Var*>const&>
                  ((vector<std::pair<kratos::Port*,kratos::Var*>,std::allocator<std::pair<kratos::Port*,kratos::Var*>>>
                    *)(internal_name.field_2._M_local_buf + 8),
                   (pair<kratos::Port_*const,_kratos::Var_*> *)(p_Var12 + 1));
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      } while ((_Rb_tree_header *)p_Var12 != p_Var1);
    }
    ppVar9 = ports.
             super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar26 = internal_name.field_2._8_8_;
    if ((pointer)internal_name.field_2._8_8_ !=
        ports.
        super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar28 = (long)ports.
                     super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - internal_name.field_2._8_8_;
      uVar13 = lVar28 >> 4;
      lVar14 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar14 == 0; lVar14 = lVar14 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<kratos::Port*,kratos::Var*>*,std::vector<std::pair<kratos::Port*,kratos::Var*>,std::allocator<std::pair<kratos::Port*,kratos::Var*>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::generate_port_interface(kratos::InstantiationStmt*)::__0>>
                (internal_name.field_2._8_8_,
                 ports.
                 super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar28 < 0x101) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<kratos::Port*,kratos::Var*>*,std::vector<std::pair<kratos::Port*,kratos::Var*>,std::allocator<std::pair<kratos::Port*,kratos::Var*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::generate_port_interface(kratos::InstantiationStmt*)::__0>>
                  (uVar26,ppVar9);
      }
      else {
        ppVar27 = (pointer)(uVar26 + 0x100);
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<kratos::Port*,kratos::Var*>*,std::vector<std::pair<kratos::Port*,kratos::Var*>,std::allocator<std::pair<kratos::Port*,kratos::Var*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::generate_port_interface(kratos::InstantiationStmt*)::__0>>
                  (uVar26,ppVar27);
        for (; ppVar27 != ppVar9; ppVar27 = ppVar27 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<kratos::Port*,kratos::Var*>*,std::vector<std::pair<kratos::Port*,kratos::Var*>,std::allocator<std::pair<kratos::Port*,kratos::Var*>>>>,__gnu_cxx::__ops::_Val_comp_iter<kratos::SystemVerilogCodeGen::generate_port_interface(kratos::InstantiationStmt*)::__0>>
                    (ppVar27);
        }
      }
    }
    ppVar9 = ports.
             super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar26 = internal_name.field_2._8_8_;
    if ((pointer)internal_name.field_2._8_8_ !=
        ports.
        super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar14 = (long)ports.
                     super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - internal_name.field_2._8_8_ >> 4;
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<kratos::Port_*,_kratos::Var_*>_*,_std::vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>_>,_std::pair<kratos::Port_*,_kratos::Var_*>_>
      ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<kratos::Port_*,_kratos::Var_*>_*,_std::vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>_>,_std::pair<kratos::Port_*,_kratos::Var_*>_>
                           *)auStack_78,
                          (__normal_iterator<std::pair<kratos::Port_*,_kratos::Var_*>_*,_std::vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>_>
                           )internal_name.field_2._8_8_,(lVar14 - (lVar14 + 1 >> 0x3f)) + 1 >> 1);
      if (i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::
        __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<kratos::Port*,kratos::Var*>*,std::vector<std::pair<kratos::Port*,kratos::Var*>,std::allocator<std::pair<kratos::Port*,kratos::Var*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::generate_port_interface(kratos::InstantiationStmt*)::__1>>
                  (uVar26,ppVar9);
      }
      else {
        std::
        __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<kratos::Port*,kratos::Var*>*,std::vector<std::pair<kratos::Port*,kratos::Var*>,std::allocator<std::pair<kratos::Port*,kratos::Var*>>>>,std::pair<kratos::Port*,kratos::Var*>*,long,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::generate_port_interface(kratos::InstantiationStmt*)::__1>>
                  (uVar26,ppVar9,
                   i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi,
                   i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      operator_delete(i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi,
                      (long)i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr << 4);
    }
    std::
    _Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Stmt_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
    ::_Rb_tree((_Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Stmt_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
                *)local_188,&(stmt->port_debug_)._M_t);
    local_1e0 = (undefined1  [8])&interface_names._M_h._M_rehash_policy._M_next_resize;
    interface_names._M_h._M_buckets = (__buckets_ptr)0x1;
    interface_names._M_h._M_bucket_count = 0;
    interface_names._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    interface_names._M_h._M_element_count._0_4_ = 0x3f800000;
    interface_names._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    interface_names._M_h._M_rehash_policy._4_4_ = 0;
    interface_names._M_h._M_rehash_policy._M_next_resize = 0;
    auStack_138 = (undefined1  [8])0x0;
    connections.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    connections.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::reserve((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)auStack_138,
              (long)ports.
                    super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - internal_name.field_2._8_8_ >> 4);
    ppVar9 = ports.
             super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pointer)internal_name.field_2._8_8_ !=
        ports.
        super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar26 = internal_name.field_2._8_8_;
      do {
        if ((this->generator_->debug == true) &&
           (debug_info._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0)) {
          pPVar4 = ((pointer)uVar26)->first;
          p_Var12 = (_Base_ptr)debug_info._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
          p_Var25 = (_Base_ptr)&debug_info;
          do {
            p_Var24 = p_Var25;
            p_Var20 = p_Var12;
            pPVar5 = *(Port **)(p_Var20 + 1);
            p_Var25 = p_Var20;
            if (pPVar5 < pPVar4) {
              p_Var25 = p_Var24;
            }
            p_Var12 = (&p_Var20->_M_left)[pPVar5 < pPVar4];
          } while ((&p_Var20->_M_left)[pPVar5 < pPVar4] != (_Base_ptr)0x0);
          if (p_Var25 != (_Base_ptr)&debug_info) {
            if (pPVar5 < pPVar4) {
              p_Var20 = p_Var24;
            }
            if (*(Port **)(p_Var20 + 1) <= pPVar4) {
              uVar6 = *(undefined8 *)&(this->stream_).super_stringstream.field_0x90;
              auStack_78 = (undefined1  [8])pPVar4;
              ppSVar15 = std::
                         map<kratos::Var_*,_kratos::Stmt_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
                         ::at((map<kratos::Var_*,_kratos::Stmt_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
                               *)local_188,(key_type *)auStack_78);
              ((*ppSVar15)->super_IRNode).verilog_ln = (uint32_t)uVar6;
            }
          }
        }
        potential_name.field_2._8_8_ = &internal_name._M_string_length;
        internal_name._M_dataplus._M_p = (pointer)0x0;
        internal_name._M_string_length._0_1_ = 0;
        ports.
        super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)&external_name._M_string_length;
        external_name._M_dataplus._M_p = (pointer)0x0;
        external_name._M_string_length._0_1_ = 0;
        iVar11 = (**stmt->_vptr_InstantiationStmt)();
        if (iVar11 == 1) {
          std::__cxx11::string::_M_assign((string *)(potential_name.field_2._M_local_buf + 8));
          std::__cxx11::string::_M_assign
                    ((string *)
                     &ports.
                      super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_001aa179:
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)auStack_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&potential_name.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ports.
                      super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)auStack_138,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)auStack_78);
          if (local_58 != local_48) {
            operator_delete(local_58,local_48[0] + 1);
          }
          if (auStack_78 !=
              (undefined1  [8])
              &i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
            operator_delete((void *)auStack_78,
                            (ulong)((long)&(i.
                                            super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
          }
        }
        else {
          iVar11 = (*(((pointer)uVar26)->first->super_Var).super_IRNode._vptr_IRNode[0x1d])
                             (((pointer)uVar26)->first);
          if ((char)iVar11 == '\0') {
            (*(((pointer)uVar26)->first->super_Var).super_IRNode._vptr_IRNode[0x1f])
                      ((Generator *)auStack_78);
            std::__cxx11::string::operator=
                      ((string *)(potential_name.field_2._M_local_buf + 8),(string *)auStack_78);
            if (auStack_78 !=
                (undefined1  [8])
                &i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
            {
              operator_delete((void *)auStack_78,
                              (ulong)((long)&(i.
                                              super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
            }
            (*(((pointer)uVar26)->second->super_IRNode)._vptr_IRNode[0x1f])((Generator *)auStack_78)
            ;
            std::__cxx11::string::operator=
                      ((string *)
                       &ports.
                        super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)auStack_78);
            if (auStack_78 !=
                (undefined1  [8])
                &i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
            {
              operator_delete((void *)auStack_78,
                              (ulong)((long)&(i.
                                              super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
            }
            goto LAB_001aa179;
          }
          Var::as<kratos::InterfacePort>
                    ((Var *)&debug_info._M_t._M_impl.super__Rb_tree_header._M_node_count);
          if (debug_info._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
            this_01 = (InternalException *)__cxa_allocate_exception(0x10);
            auStack_78 = (undefined1  [8])
                         &i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)auStack_78,"Unable to cast port","");
            InternalException::InternalException(this_01,(string *)auStack_78);
            __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
          }
          puVar7 = *(undefined8 **)
                    (debug_info._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x280);
          std::__cxx11::string::_M_assign((string *)(potential_name.field_2._M_local_buf + 8));
          cVar10 = (**(code **)(*(long *)*puVar7 + 0x40))();
          if (cVar10 == '\0') {
            (*(((pointer)uVar26)->second->super_IRNode)._vptr_IRNode[0x27])((Generator *)auStack_78)
            ;
            std::__cxx11::string::operator=
                      ((string *)
                       &ports.
                        super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)auStack_78);
            _Var21 = i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount;
            auVar23 = auStack_78;
            if (auStack_78 !=
                (undefined1  [8])
                &i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
            goto LAB_001aa0d4;
          }
          else {
            plVar16 = (long *)(**(code **)(*(long *)*puVar7 + 0x30))();
            auStack_118 = (undefined1  [8])&mod_port_name._M_string_length;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)auStack_118,*plVar16,plVar16[1] + *plVar16);
            (*(((pointer)uVar26)->second->super_IRNode)._vptr_IRNode[0x27])((Generator *)auStack_78)
            ;
            std::__cxx11::string::operator=
                      ((string *)
                       &ports.
                        super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)auStack_78);
            if (auStack_78 !=
                (undefined1  [8])
                &i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
            {
              operator_delete((void *)auStack_78,
                              (ulong)((long)&(i.
                                              super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
            }
            auStack_78 = (undefined1  [8])
                         ports.
                         super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
            i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)external_name._M_dataplus._M_p;
            i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_118;
            format_str.size_ = 0xdd;
            format_str.data_ = (char *)0x7;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)auStack_78;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)((long)&mod_port_name.field_2 + 8),(detail *)0x249b7d,format_str,
                       args);
            iVar11 = (*(((pointer)uVar26)->second->super_IRNode)._vptr_IRNode[0xd])();
            Generator::get_interface
                      ((Generator *)auStack_78,(string *)CONCAT44(extraout_var,iVar11));
            if ((auStack_78 != (undefined1  [8])0x0) &&
               (cVar10 = (**(code **)(**(long **)auStack_78 + 0x40))(), cVar10 == '\0')) {
              std::__cxx11::string::_M_assign
                        ((string *)
                         &ports.
                          super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            if (i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
            }
            if ((size_type *)mod_port_name.field_2._8_8_ != &potential_name._M_string_length) {
              operator_delete((void *)mod_port_name.field_2._8_8_,
                              potential_name._M_string_length + 1);
            }
            _Var21._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           mod_port_name._M_string_length;
            auVar23 = auStack_118;
            if (auStack_118 != (undefined1  [8])&mod_port_name._M_string_length) {
LAB_001aa0d4:
              operator_delete((void *)auVar23,
                              (ulong)((long)&(_Var21._M_pi)->_vptr__Sp_counted_base + 1));
            }
          }
          iVar17 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)local_1e0,(key_type *)((long)&potential_name.field_2 + 8));
          if (iVar17.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::__cxx11::string&,std::__cxx11::string&>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)local_1e0,(undefined1 *)((long)&potential_name.field_2 + 8),
                       &ports.
                        super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          else {
            iVar18 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)local_1e0,(key_type *)((long)&potential_name.field_2 + 8));
            if (iVar18.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
            }
            __n = *(pointer *)
                   ((long)iVar18.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                          ._M_cur + 0x30);
            if ((__n != external_name._M_dataplus._M_p) ||
               ((__n != (pointer)0x0 &&
                (iVar11 = bcmp(*(void **)((long)iVar18.
                                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                                ._M_cur + 0x28),
                               ports.
                               super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_t)__n),
                iVar11 != 0)))) {
              this_00 = (StmtException *)__cxa_allocate_exception(0x10);
              (*(((pointer)uVar26)->first->super_Var).super_IRNode._vptr_IRNode[0x20])
                        ((undefined1 *)((long)&mod_port_name.field_2 + 8));
              (*(((pointer)uVar26)->second->super_IRNode)._vptr_IRNode[0x20])
                        (&interface_names._M_h._M_single_bucket);
              auStack_78 = (undefined1  [8])mod_port_name.field_2._8_8_;
              i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)potential_name._M_dataplus._M_p;
              i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      interface_names._M_h._M_single_bucket;
              format_str_00.size_ = 0xdd;
              format_str_00.data_ = (char *)0x36;
              args_00.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .field_1.args_ = in_R9.args_;
              args_00.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .desc_ = (unsigned_long_long)auStack_78;
              fmt::v7::detail::vformat_abi_cxx11_
                        ((string *)auStack_118,
                         (detail *)"{0} and {1} are not from the same interface definition",
                         format_str_00,args_00);
              local_1f0 = ((pointer)uVar26)->first;
              local_1e8 = ((pointer)uVar26)->second;
              __l._M_len = 2;
              __l._M_array = (iterator)&local_1f0;
              std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                        ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_78,
                         __l,&local_31);
              StmtException::StmtException
                        (this_00,(string *)auStack_118,
                         (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_78);
              __cxa_throw(this_00,&StmtException::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          if (internal_interface.
              super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       internal_interface.
                       super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
          }
          if (iVar17.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              ._M_cur == (__node_type *)0x0) goto LAB_001aa179;
        }
        if (ports.
            super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage !=
            (pointer)&external_name._M_string_length) {
          operator_delete(ports.
                          super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          CONCAT71(external_name._M_string_length._1_7_,
                                   (undefined1)external_name._M_string_length) + 1);
        }
        if ((size_type *)potential_name.field_2._8_8_ != &internal_name._M_string_length) {
          operator_delete((void *)potential_name.field_2._8_8_,
                          CONCAT71(internal_name._M_string_length._1_7_,
                                   (undefined1)internal_name._M_string_length) + 1);
        }
        uVar26 = uVar26 + 0x10;
      } while ((pointer)uVar26 != ppVar9);
    }
    if ((undefined1  [8])
        connections.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != auStack_138) {
      lVar14 = 0x28;
      uVar13 = 0;
      do {
        auVar23 = auStack_138;
        sVar29 = indent(this);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)external_name.field_2._8_8_,sVar29._M_str,sVar29._M_len);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,".",1);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar19,*(char **)((long)auVar23 + lVar14 + -0x28),
                             *(long *)((long)auVar23 + lVar14 + -0x20));
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"(",1);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar19,*(char **)((long)auVar23 + lVar14 + -8),
                             *(long *)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)auVar23)->_M_dataplus)._M_p + lVar14));
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,")",1);
        if (uVar13 == ((long)connections.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)auStack_138 >> 6) -
                      1U) {
          puVar2 = &(this->stream_).super_stringstream.field_0x90;
          *(long *)puVar2 = *(long *)puVar2 + 1;
          auStack_78[0] = (string)0xa;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)external_name.field_2._8_8_,auStack_78,1);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)external_name.field_2._8_8_,",",1);
          puVar2 = &(this->stream_).super_stringstream.field_0x90;
          *(long *)puVar2 = *(long *)puVar2 + 1;
          auStack_78[0] = (string)0xa;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)external_name.field_2._8_8_,auStack_78,1);
        }
        uVar13 = uVar13 + 1;
        lVar14 = lVar14 + 0x40;
      } while (uVar13 < (ulong)((long)connections.
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start - (long)auStack_138
                               >> 6));
    }
    if (this->indent_ == 0) {
      pcVar22 = "";
      uVar13 = 0;
    }
    else {
      uVar13 = (ulong)this->indent_size * (this->indent_ - 1);
      uVar8 = (this->empty_indent_string_view_)._M_len;
      if (uVar8 < uVar13) {
        uVar13 = uVar8;
      }
      pcVar22 = (this->empty_indent_string_view_)._M_str;
    }
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)external_name.field_2._8_8_,pcVar22,uVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,");",2);
    puVar2 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar2 = *(long *)puVar2 + 1;
    auStack_78[0] = (string)0xa;
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,auStack_78,1);
    puVar2 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar2 = *(long *)puVar2 + 1;
    auStack_78[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,auStack_78,1);
    this->indent_ = this->indent_ - 1;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)auStack_138);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_1e0);
    std::
    _Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Stmt_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
    ::~_Rb_tree((_Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Stmt_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
                 *)local_188);
    if (internal_name.field_2._8_8_ != 0) {
      operator_delete((void *)internal_name.field_2._8_8_,
                      (long)ports.
                            super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - internal_name.field_2._8_8_
                     );
    }
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::generate_port_interface(kratos::InstantiationStmt* stmt) {
    if (stmt->port_mapping().empty()) {
        stream_ << "();" << stream_.endl();
        return;
    }
    stream_ << " (" << stream_.endl();
    indent_++;
    std::vector<std::pair<Port*, Var*>> ports;
    auto const& mapping = stmt->port_mapping();
    ports.reserve(mapping.size());
    for (auto const& iter : mapping) ports.emplace_back(iter);
    std::sort(ports.begin(), ports.end(),
              [](const auto& lhs, const auto& rhs) { return lhs.first->name < rhs.first->name; });
    // sort again based on the input and output
    // use stable sort to preserve the previous order
    std::stable_sort(ports.begin(), ports.end(), [](const auto& lhs, const auto& rhs) {
        return lhs.first->port_direction() == PortDirection::In &&
               rhs.first->port_direction() == PortDirection::Out;
    });

    auto debug_info = stmt->port_debug();
    std::unordered_map<std::string, std::string> interface_names;
    std::vector<std::pair<std::string, std::string>> connections;
    connections.reserve(ports.size());
    for (auto const& [internal, external] : ports) {
        if (generator_->debug && debug_info.find(internal) != debug_info.end()) {
            debug_info.at(internal)->verilog_ln = stream_.line_no();
        }
        std::string internal_name;
        std::string external_name;
        if (stmt->instantiation_type() == InstantiationStmt::InstantiationType::Interface) {
            internal_name = internal->name;
            external_name = external->name;
        } else {
            // module
            if (!internal->is_interface()) {
                internal_name = internal->to_string();
                external_name = external->to_string();
            } else {
                // we assume the interface connectivity has been checked
                // internal has to be an interface
                auto internal_interface = internal->as<InterfacePort>();
                if (!internal_interface) throw InternalException("Unable to cast port");
                const auto* internal_def = internal_interface->interface();
                internal_name = internal_def->name();
                if (internal_def->definition()->is_modport()) {
                    // it's a mod port
                    // get the mod port name
                    auto mod_port_name = internal_def->definition()->name();
                    external_name = external->base_name();
                    // FIXME: this is a little bit hacky here
                    auto potential_name = ::format("{0}.{1}", external_name, mod_port_name);
                    auto i = external->generator()->get_interface(external_name);
                    if (i && !i->definition()->is_modport()) {
                        external_name = potential_name;
                    }
                } else {
                    external_name = external->base_name();
                }

                if (interface_names.find(internal_name) != interface_names.end()) {
                    if (interface_names.at(internal_name) != external_name) {
                        throw StmtException(
                            ::format("{0} and {1} are not from the same interface definition",
                                     internal->handle_name(), external->handle_name()),
                            {internal, external});
                    }
                    continue;
                }
                interface_names.emplace(internal_name, external_name);
            }
        }
        connections.emplace_back(std::make_pair(internal_name, external_name));
    }
    for (uint64_t i = 0; i < connections.size(); i++) {
        auto const& [internal_name, external_name] = connections[i];
        stream_ << indent() << "." << internal_name << "(" << external_name << ")";
        if (i != connections.size() - 1)
            stream_ << "," << stream_.endl();
        else
            stream_ << stream_.endl();
    }
    stream_ << pre_indent() << ");" << stream_.endl() << stream_.endl();
    indent_--;
}